

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_statement_t * ztast_statement_from_assignment(ztast_t *ast,ztast_assignment_t *assignment)

{
  ztast_statement_data in_RSI;
  long in_RDI;
  ztast_statement_t *stmt;
  ztast_statement_t *local_8;
  
  local_8 = (ztast_statement_t *)(**(code **)(in_RDI + 8))(0x18,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_statement_t *)0x0) {
    local_8 = (ztast_statement_t *)0x0;
  }
  else {
    local_8->next = (ztast_statement *)0x0;
    local_8->type = ZTSTMT_ASSIGNMENT;
    local_8->u = in_RSI;
  }
  return local_8;
}

Assistant:

ztast_statement_t *ztast_statement_from_assignment(ztast_t            *ast,
                                                   ztast_assignment_t *assignment)
{
  ztast_statement_t *stmt;

  assert(ast);
  assert(assignment);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_statement_from_assignment %p", assignment);
#endif

  stmt = ZTAST_MALLOC(sizeof(*stmt));
  if (stmt == NULL)
    return NULL;

  stmt->next         = NULL;
  stmt->type         = ZTSTMT_ASSIGNMENT;
  stmt->u.assignment = assignment;

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn(" -> %p\n", stmt);
#endif

  return stmt;
}